

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O3

UChar32 uiter_next32_63(UCharIterator *iter)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (*(code *)iter->next)();
  if ((uVar1 & 0xfffffc00) == 0xd800) {
    uVar2 = (*(code *)iter->next)(iter);
    if ((uVar2 & 0xfffffc00) == 0xdc00) {
      uVar1 = uVar1 * 0x400 + uVar2 + 0xfca02400;
    }
    else if (-1 < (int)uVar2) {
      (*iter->move)(iter,-1,UITER_CURRENT);
    }
  }
  return uVar1;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
uiter_next32(UCharIterator *iter) {
    UChar32 c, c2;

    c=iter->next(iter);
    if(U16_IS_LEAD(c)) {
        if(U16_IS_TRAIL(c2=iter->next(iter))) {
            c=U16_GET_SUPPLEMENTARY(c, c2);
        } else if(c2>=0) {
            /* unmatched first surrogate, undo index movement */
            iter->move(iter, -1, UITER_CURRENT);
        }
    }
    return c;
}